

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardrtn.c
# Opt level: O2

int slowreturn(void)

{
  ushort uVar1;
  DLword DVar2;
  LispPTR LVar3;
  uint uVar4;
  FX *frame68k;
  LispPTR *pLVar5;
  DLword *pDVar6;
  DLword *pDVar7;
  
  frame68k = (FX *)NativeAligned4FromStackOffset
                             ((short)*(undefined4 *)(MachineState.pvar + -10) - 0xb);
  DVar2 = MachineState.pvar[-2];
  if ((MachineState.pvar[-10] & 0xfffe) != DVar2) {
    if ((MachineState.pvar[-10] & 1) == 0) {
      LVar3 = LAddrFromNative(MachineState.pvar + -0xc);
      MachineState.pvar[-1] = (DLword)LVar3;
      MachineState.pvar[-2] = MachineState.pvar[-10];
      DVar2 = MachineState.pvar[-2];
    }
    MachineState.pvar[-10] = DVar2 + 0xb;
    decusecount68k(frame68k);
    frame68k = (FX *)NativeAligned4FromStackOffset
                               ((short)*(undefined4 *)(MachineState.pvar + -2) - 10);
  }
  if (frame68k->field_0x2 == '\0') goto LAB_001205bc;
  MachineState.csp = MachineState.csp + 2;
  DVar2 = StackOffsetFromNative(MachineState.csp);
  MachineState.pvar[-5] = DVar2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
  *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
       (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
  if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
    error("0-long free block.");
  }
  frame68k = make_FXcopy(frame68k);
  if (frame68k == (FX *)0x0) {
    return 1;
  }
  pDVar6 = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
  pDVar7 = pDVar6;
  if (*(short *)((ulong)pDVar6 ^ 2) != -0x6000) {
    error("pre_moveframe: MP9316");
  }
  while (*(short *)((ulong)pDVar7 ^ 2) == -0x6000) {
    MachineState.endofstack = pDVar7 + *(ushort *)((ulong)(pDVar7 + 1) ^ 2);
    pDVar7 = MachineState.endofstack;
  }
  while( true ) {
    MachineState.csp = pDVar6 + -2;
LAB_001205bc:
    pDVar7 = (DLword *)((ulong)((uint)frame68k->nextblock * 2) + (long)Stackspace);
    pLVar5 = NativeAligned4FromStackOffset(MachineState.pvar[-1]);
    if (*(short *)((ulong)pDVar7 ^ 2) == -0x6000) break;
    if (pDVar7 == MachineState.ivar) {
      if (*(char *)((long)pLVar5 + 2) == '\0') break;
      MachineState.csp = MachineState.csp + 2;
      DVar2 = StackOffsetFromNative(MachineState.csp);
      MachineState.pvar[-5] = DVar2;
      *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
      *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
           (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
      if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
        error("0-long free block.");
      }
      frame68k = make_FXcopy(frame68k);
      if (frame68k == (FX *)0x0) {
        return 1;
      }
      pDVar6 = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
      pDVar7 = pDVar6;
      if (*(short *)((ulong)pDVar6 ^ 2) != -0x6000) {
        error("pre_moveframe: MP9316");
      }
      while (*(short *)((ulong)pDVar7 ^ 2) == -0x6000) {
        MachineState.endofstack = pDVar7 + *(ushort *)((ulong)(pDVar7 + 1) ^ 2);
        pDVar7 = MachineState.endofstack;
      }
    }
    else {
      MachineState.csp = MachineState.csp + 2;
      DVar2 = StackOffsetFromNative(MachineState.csp);
      MachineState.pvar[-5] = DVar2;
      *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
      *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
           (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
      if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
        error("0-long free block.");
      }
      frame68k = make_FXcopy(frame68k);
      if (frame68k == (FX *)0x0) {
        return 1;
      }
      pDVar6 = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
      pDVar7 = pDVar6;
      if (*(short *)((ulong)pDVar6 ^ 2) != -0x6000) {
        error("pre_moveframe: MP9316");
      }
      while (*(short *)((ulong)pDVar7 ^ 2) == -0x6000) {
        MachineState.endofstack = pDVar7 + *(ushort *)((ulong)(pDVar7 + 1) ^ 2);
        pDVar7 = MachineState.endofstack;
      }
    }
  }
  pDVar6 = MachineState.ivar;
  if ((*MachineState.pvar & 0x2000000) != 0) {
    pDVar6 = MachineState.pvar + -0xc;
    uVar1 = *(ushort *)((long)pLVar5 + 2);
    if ((char)uVar1 == '\0') {
      *(undefined2 *)((ulong)MachineState.ivar ^ 2) = 0xa000;
      *(short *)((ulong)(MachineState.ivar + 1) ^ 2) =
           (short)((uint)((int)pLVar5 - (int)MachineState.ivar) >> 1) + 2;
      if (*(short *)((ulong)(MachineState.ivar + 1) ^ 2) == 0) {
        error("creating 0-len block");
      }
    }
    else {
      *(ushort *)((long)pLVar5 + 2) = uVar1 & 0xff00 | uVar1 - 1 & 0xff;
    }
  }
  *(undefined2 *)((ulong)pDVar6 ^ 2) = 0xa000;
  uVar4 = (int)MachineState.endofstack - (int)pDVar6;
  *(short *)((ulong)(pDVar6 + 1) ^ 2) = (short)(uVar4 >> 1);
  if ((uVar4 & 0x1fffe) == 0) {
    error("creating 0-len block");
  }
  MachineState.pvar = &frame68k[1].alink;
  pDVar6 = pDVar7;
  if (*(short *)((ulong)pDVar7 ^ 2) != -0x6000) {
    error("OP_return: MP9316");
  }
  while (*(short *)((ulong)pDVar6 ^ 2) == -0x6000) {
    MachineState.endofstack = pDVar6 + *(ushort *)((ulong)(pDVar6 + 1) ^ 2);
    pDVar6 = MachineState.endofstack;
  }
  uVar1 = MachineState.pvar[-9];
  if ((uVar1 >> 10 & 1) == 0) {
    if ((uVar1 >> 8 & 1) == 0) {
      MachineState.csp = pDVar7 + -2;
    }
    else {
      MachineState.pvar[-9] = uVar1 & 0xfaff;
      MachineState.tosvalue = *(LispPTR *)(pDVar7 + -2);
      MachineState.csp = pDVar7 + -4;
    }
    MachineState.ivar =
         (DLword *)
         ((ulong)((uint)*(ushort *)((ulong)(MachineState.pvar + -0xb) ^ 2) * 2) + (long)Stackspace);
    uVar4 = *(uint *)(MachineState.pvar + -8);
    if ((uVar4 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar4);
    }
    MachineState.currentfunc = (fnhead *)(Lisp_world + uVar4);
    MachineState.currentpc =
         (ByteCode *)((long)&(MachineState.currentfunc)->na + (ulong)MachineState.pvar[-6]);
  }
  else {
    error("Stack error: INCALL bit found in returnee frame");
    error("Control reached end of slowreturn()!");
  }
  return 0;
}

Assistant:

int slowreturn(void) {
  DLword *next68k;
  DLword *freeptr;
  Bframe *currentBF;
  FX *returnFX;

  S_CHECK(SLOWP(CURRENTFX), "CURRENTFX not SLOWP");

  /* Get returnee's FX from CURRENTFX->alink , It's SLOWP case */
  returnFX = (FX *)NativeAligned4FromStackOffset(CURRENTFX->alink - 11);

  if ((CURRENTFX->alink & 0xFFFE) != CURRENTFX->clink) { /* ALINK != CLINK */
#ifdef STACKCHECK
    printf("A!=C\n");
#endif
    /* return to CLINK fx */
    SETALINK(CURRENTFX, CURRENTFX->clink);
    decusecount68k(returnFX);
    returnFX = (FX *)NativeAligned4FromStackOffset(CURRENTFX->clink - FRAMESIZE);
  }

  if (returnFX->usecount != 0) { /* COPY returnee's FX */
#ifdef STACKCHECK
    printf("returnFX->usecount !=0\n");
#endif
    MAKE_FXCOPY(returnFX); /* smashes returnFX */
  }

retry: /* this is retry entry after MAKE_FXCOPY etc */

  next68k = NativeAligned2FromStackOffset(returnFX->nextblock);
  currentBF = (Bframe *)NativeAligned4FromStackOffset(CURRENTFX->blink);

  if (GETWORD(next68k) == STK_FSB_WORD) {
  another:
    freeptr = ((DLword *)CURRENTFX) - 2;
    if (BFRAMEPTR(freeptr)->residual) {
      if (BFRAMEPTR(currentBF)->usecnt == 0) {
        /* make FREEBLOCK for real BF */
        GETWORD(IVar) = STK_FSB_WORD;
        GETWORD(IVar + 1) = (((UNSIGNED)currentBF - (UNSIGNED)IVar) >> 1) + 2;
        if (0 == GETWORD(IVar + 1)) error("creating 0-len block");
      } else
        BFRAMEPTR(currentBF)->usecnt--;
    } else
      freeptr = IVar; /* reset free ptr: not residual case */

    /* free FX + BF(dummy or real) */
    GETWORD(freeptr) = STK_FSB_WORD;
    GETWORD(freeptr + 1) = ((UNSIGNED)EndSTKP - (UNSIGNED)freeptr) >> 1;
    if (0 == GETWORD(freeptr + 1)) error("creating 0-len block");
    S_CHECK(EndSTKP >= freeptr, "EndSTKP < freeptr!");
    S_CHECK(FSB_size(freeptr) >= MINEXTRASTACKWORDS,
            "free block < min size, after deciding it fits.");

    PVar = ((DLword *)returnFX) + FRAMESIZE;
    /*  Now right CURRENTFX(PVar) is set */

    if (GETWORD(next68k) != STK_FSB_WORD) error("OP_return: MP9316");

    freeptr = next68k;
    while (GETWORD(freeptr) == STK_FSB_WORD) EndSTKP = freeptr = freeptr + GETWORD(freeptr + 1);

    if (CURRENTFX->incall) { /* this frame is  Interrupted */
      error("Stack error: INCALL bit found in returnee frame");
    } else {
      if (CURRENTFX->nopush) {
        CURRENTFX->nopush = NIL;
        CurrentStackPTR = next68k - 2;
        TopOfStack = *((LispPTR *)CurrentStackPTR);
        CurrentStackPTR -= 2;

      } else
        CurrentStackPTR = next68k - 2;

      S_CHECK(EndSTKP >= freeptr, "EndSTKP < freeptr");

      FastRetCALL;
#ifdef LISPTRACE
      printf("TRACE: return from ");
      print(fnobj->framename);
      printf(" :<= ");
      print(TopOfStack);
      printf("\n");
#endif
      return (0); /* normal return */
    }

  } /* FSB end */
  else if (next68k != IVar) {
#ifdef STACKCHECK
    printf("next68k != IVar and not FSB\n");
#endif
    MAKE_FXCOPY(returnFX); /* smashes returnFX */
    goto retry;
  } else if (BFRAMEPTR(currentBF)->usecnt != 0) {
#ifdef STACKCHECK
    printf("currentBF->usecnt != 0");
#endif
    MAKE_FXCOPY(returnFX); /* smashes returnFX */
    goto retry;
  } else {
    if ((next68k == IVar) || (BFRAMEPTR(currentBF)->usecnt == 0))
      goto another;
    else
      error("Shouldn't");
  }
  error("Control reached end of slowreturn()!");
  return (NIL); /* NOT REACHED */
}